

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_PackBegin(stbtt_pack_context *spc,uchar *pixels,int pw,int ph,int stride_in_bytes,
                   int padding,void *alloc_context)

{
  int *__ptr;
  void *__ptr_00;
  int iVar1;
  
  __ptr = (int *)malloc(0x14);
  __ptr_00 = malloc((long)(pw - padding));
  if (__ptr == (int *)0x0 || __ptr_00 == (void *)0x0) {
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    iVar1 = 0;
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
      iVar1 = 0;
    }
  }
  else {
    spc->user_allocator_context = alloc_context;
    spc->width = pw;
    spc->height = ph;
    spc->pixels = pixels;
    spc->pack_info = __ptr;
    spc->nodes = __ptr_00;
    if (stride_in_bytes == 0) {
      stride_in_bytes = pw;
    }
    spc->padding = padding;
    spc->stride_in_bytes = stride_in_bytes;
    spc->h_oversample = 1;
    spc->v_oversample = 1;
    *__ptr = pw - padding;
    __ptr[1] = ph - padding;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[4] = 0;
    iVar1 = 1;
    if (pixels != (uchar *)0x0) {
      memset(pixels,0,(long)(ph * pw));
    }
  }
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_PackBegin(stbtt_pack_context *spc, unsigned char *pixels, int pw, int ph, int stride_in_bytes, int padding, void *alloc_context)
{
   stbrp_context *context = (stbrp_context *) STBTT_malloc(sizeof(*context)            ,alloc_context);
   int            num_nodes = pw - padding;
   stbrp_node    *nodes   = (stbrp_node    *) STBTT_malloc(sizeof(*nodes  ) * num_nodes,alloc_context);

   if (context == NULL || nodes == NULL) {
      if (context != NULL) STBTT_free(context, alloc_context);
      if (nodes   != NULL) STBTT_free(nodes  , alloc_context);
      return 0;
   }

   spc->user_allocator_context = alloc_context;
   spc->width = pw;
   spc->height = ph;
   spc->pixels = pixels;
   spc->pack_info = context;
   spc->nodes = nodes;
   spc->padding = padding;
   spc->stride_in_bytes = stride_in_bytes != 0 ? stride_in_bytes : pw;
   spc->h_oversample = 1;
   spc->v_oversample = 1;

   stbrp_init_target(context, pw-padding, ph-padding, nodes, num_nodes);

   if (pixels)
      STBTT_memset(pixels, 0, pw*ph); // background of 0 around pixels

   return 1;
}